

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O1

bool __thiscall OSToken::resetToken(OSToken *this,ByteString *label)

{
  long lVar1;
  Directory *pDVar2;
  int iVar3;
  ObjectFile *this_00;
  OSAttribute *pOVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  int iVar7;
  int loglevel;
  char *pcVar8;
  _Self __tmp;
  pair<std::_Rb_tree_iterator<OSObject_*>,_std::_Rb_tree_iterator<OSObject_*>_> pVar9;
  MutexLocker lock;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> cleanUp;
  OSAttribute tokenLabel;
  OSAttribute tokenFlags;
  uint local_200;
  undefined4 uStack_1fc;
  ByteString *local_1f8;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  MutexLocker local_1b0;
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  local_1a0;
  OSAttribute local_170;
  OSAttribute local_d0;
  
  iVar3 = (*(this->super_ObjectStoreToken)._vptr_ObjectStoreToken[4])(this,&local_200);
  if ((char)iVar3 == '\0') {
    softHSMLog(3,"resetToken",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
               ,499,"Failed to get the token attributes");
    return false;
  }
  local_1f8 = label;
  (*(this->super_ObjectStoreToken)._vptr_ObjectStoreToken[8])(&local_1a0,this);
  MutexLocker::MutexLocker(&local_1b0,this->tokenMutex);
  if ((_Rb_tree_header *)local_1a0._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_1a0._M_impl.super__Rb_tree_header) {
    p_Var5 = local_1a0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      lVar1 = *(long *)(p_Var5 + 1);
      if (lVar1 == 0) {
        this_00 = (ObjectFile *)0x0;
      }
      else {
        this_00 = (ObjectFile *)__dynamic_cast(lVar1,&OSObject::typeinfo,&ObjectFile::typeinfo,0);
      }
      if (this_00 == (ObjectFile *)0x0) {
        bVar6 = false;
        softHSMLog(3,"resetToken",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                   ,0x202,"Object type not compatible with this token class 0x%08X",lVar1);
        goto LAB_0016dc17;
      }
      ObjectFile::invalidate(this_00);
      ObjectFile::getFilename_abi_cxx11_((string *)&local_170,this_00);
      pDVar2 = this->tokenDir;
      local_1d0[0] = local_1c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1d0,local_170._vptr_OSAttribute,
                 (undefined1 *)((long)local_170._vptr_OSAttribute + local_170._8_8_));
      iVar3 = Directory::remove(pDVar2,(char *)local_1d0);
      if (local_1d0[0] != local_1c0) {
        operator_delete(local_1d0[0]);
      }
      if ((char)iVar3 == '\0') {
        softHSMLog(3,"resetToken",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                   ,0x210,"Failed to delete object file %s",local_170._vptr_OSAttribute);
        if (local_170._vptr_OSAttribute != (_func_int **)&local_170.ulongValue) {
          operator_delete(local_170._vptr_OSAttribute);
        }
LAB_0016dbcc:
        bVar6 = false;
        goto LAB_0016dc17;
      }
      ObjectFile::getLockname_abi_cxx11_((string *)&local_d0,this_00);
      pDVar2 = this->tokenDir;
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f0,local_d0._vptr_OSAttribute,
                 (undefined1 *)((long)local_d0._vptr_OSAttribute + local_d0._8_8_));
      iVar3 = Directory::remove(pDVar2,(char *)local_1f0);
      if (local_1f0[0] != local_1e0) {
        operator_delete(local_1f0[0]);
      }
      if ((char)iVar3 == '\0') {
        iVar7 = 0x21b;
        loglevel = 3;
        pcVar8 = "Failed to delete lock file %s";
        pOVar4 = &local_d0;
      }
      else {
        pVar9 = std::
                _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
                ::equal_range(&(this->objects)._M_t,(key_type *)(p_Var5 + 1));
        std::
        _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
        ::_M_erase_aux(&(this->objects)._M_t,(_Base_ptr)pVar9.first._M_node,
                       (_Base_ptr)pVar9.second._M_node);
        iVar7 = 0x222;
        loglevel = 7;
        pcVar8 = "Deleted object %s";
        pOVar4 = &local_170;
      }
      softHSMLog(loglevel,"resetToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,iVar7,pcVar8,pOVar4->_vptr_OSAttribute);
      if (local_d0._vptr_OSAttribute != (_func_int **)&local_d0.ulongValue) {
        operator_delete(local_d0._vptr_OSAttribute);
      }
      if (local_170._vptr_OSAttribute != (_func_int **)&local_170.ulongValue) {
        operator_delete(local_170._vptr_OSAttribute);
      }
      if ((char)iVar3 == '\0') goto LAB_0016dbcc;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_1a0._M_impl.super__Rb_tree_header);
  }
  local_200 = local_200 & 0xfff0fff7;
  OSAttribute::OSAttribute(&local_170,local_1f8);
  OSAttribute::OSAttribute(&local_d0,CONCAT44(uStack_1fc,local_200));
  iVar3 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[8])
                    (this->tokenObject,0x80005349,&local_170);
  pcVar8 = "Failed to set the token attributes";
  iVar7 = 0x233;
  if (((char)iVar3 != '\0') &&
     (iVar3 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[8])
                        (this->tokenObject,0x8000534b,&local_d0), (char)iVar3 != '\0')) {
    iVar3 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[2])(this->tokenObject,0x8000534d);
    if (((char)iVar3 == '\0') ||
       (iVar3 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[9])
                          (this->tokenObject,0x8000534d), (char)iVar3 != '\0')) {
      softHSMLog(7,"resetToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x240,"Token instance %s was succesfully reset",(this->tokenPath)._M_dataplus._M_p
                );
      Generation::update(this->gen);
      bVar6 = true;
      Generation::commit(this->gen);
      goto LAB_0016dbfd;
    }
    pcVar8 = "Failed to remove USERPIN";
    iVar7 = 0x23b;
  }
  bVar6 = false;
  softHSMLog(3,"resetToken",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
             ,iVar7,pcVar8);
LAB_0016dbfd:
  OSAttribute::~OSAttribute(&local_d0);
  OSAttribute::~OSAttribute(&local_170);
LAB_0016dc17:
  MutexLocker::~MutexLocker(&local_1b0);
  std::
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  ::~_Rb_tree(&local_1a0);
  return bVar6;
}

Assistant:

bool OSToken::resetToken(const ByteString& label)
{
	CK_ULONG flags;

	if (!getTokenFlags(flags))
	{
		ERROR_MSG("Failed to get the token attributes");

		return false;
	}

	// Clean up
	std::set<OSObject*> cleanUp = getObjects();

	MutexLocker lock(tokenMutex);

	for (std::set<OSObject*>::iterator i = cleanUp.begin(); i != cleanUp.end(); i++)
	{
		ObjectFile* fileObject = dynamic_cast<ObjectFile*>(*i);
		if (fileObject == NULL)
		{
			ERROR_MSG("Object type not compatible with this token class 0x%08X", *i);

			return false;
		}

		// Invalidate the object instance
		fileObject->invalidate();

		// Retrieve the filename of the object
		std::string objectFilename = fileObject->getFilename();

		// Attempt to delete the file
		if (!tokenDir->remove(objectFilename))
		{
			ERROR_MSG("Failed to delete object file %s", objectFilename.c_str());

			return false;
		}

		// Retrieve the filename of the lock
		std::string lockFilename = fileObject->getLockname();

		// Attempt to delete the lock
		if (!tokenDir->remove(lockFilename))
		{
			ERROR_MSG("Failed to delete lock file %s", lockFilename.c_str());

			return false;
		}

		objects.erase(*i);

		DEBUG_MSG("Deleted object %s", objectFilename.c_str());
	}

	// The user PIN has been removed
	flags &= ~CKF_USER_PIN_INITIALIZED;
	flags &= ~CKF_USER_PIN_COUNT_LOW;
	flags &= ~CKF_USER_PIN_FINAL_TRY;
	flags &= ~CKF_USER_PIN_LOCKED;
	flags &= ~CKF_USER_PIN_TO_BE_CHANGED;

	// Set new token attributes
	OSAttribute tokenLabel(label);
	OSAttribute tokenFlags(flags);

	if (!tokenObject->setAttribute(CKA_OS_TOKENLABEL, tokenLabel) ||
	    !tokenObject->setAttribute(CKA_OS_TOKENFLAGS, tokenFlags))
	{
		ERROR_MSG("Failed to set the token attributes");

		return false;
	}

	if (tokenObject->attributeExists(CKA_OS_USERPIN) &&
	    !tokenObject->deleteAttribute(CKA_OS_USERPIN))
	{
		ERROR_MSG("Failed to remove USERPIN");

		return false;
	}

	DEBUG_MSG("Token instance %s was succesfully reset", tokenPath.c_str());

	gen->update();
	gen->commit();

	return true;
}